

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

bool __thiscall cmListFileParser::ParseFunction(cmListFileParser *this,char *name,long line)

{
  cmMessenger *this_00;
  bool bVar1;
  cmListFileLexer_Token *pcVar2;
  long lVar3;
  ostream *poVar4;
  char *pcVar5;
  anon_enum_32 aVar6;
  long lVar7;
  cmListFileBacktrace lfbt;
  cmListFileContext lfc;
  string local_1c8;
  ostringstream error;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _Alloc_hider local_188;
  size_type sStack_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  long local_168;
  pointer pcStack_160;
  pointer local_158;
  pointer pcStack_150;
  
  _error = (pointer)&local_198;
  sStack_180 = 0;
  local_178._8_8_ = 0;
  local_198._M_allocated_capacity = 0;
  local_198._8_8_ = 0;
  local_188._M_p = (pointer)&local_178;
  local_178._M_allocated_capacity = 0;
  local_168 = 0;
  pcStack_160 = (pointer)0x0;
  local_158 = (pointer)0x0;
  pcStack_150 = (pointer)0x0;
  cmListFileFunction::operator=(&this->Function,(cmListFileFunction *)&error);
  cmListFileFunction::~cmListFileFunction((cmListFileFunction *)&error);
  std::__cxx11::string::string<std::allocator<char>>((string *)&error,name,(allocator<char> *)&lfc);
  cmCommandContext::cmCommandName::operator=((cmCommandName *)&this->Function,(string *)&error);
  std::__cxx11::string::~string((string *)&error);
  (this->Function).super_cmCommandContext.Line = line;
  do {
    pcVar2 = cmListFileLexer_Scan(this->Lexer);
    if (pcVar2 == (cmListFileLexer_Token *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
      poVar4 = std::operator<<((ostream *)&error,"Unexpected end of file.\n");
      std::operator<<(poVar4,"Parse error.  Function missing opening \"(\".");
      std::__cxx11::stringbuf::str();
      IssueError(this,&lfc.Name);
      goto LAB_0025adbc;
    }
  } while (pcVar2->type == cmListFileLexer_Token_Space);
  if (pcVar2->type != cmListFileLexer_Token_ParenLeft) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
    poVar4 = std::operator<<((ostream *)&error,"Parse error.  Expected \"(\", got ");
    pcVar5 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar2->type);
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4," with text \"");
    poVar4 = std::operator<<(poVar4,pcVar2->text);
    std::operator<<(poVar4,"\".");
    std::__cxx11::stringbuf::str();
    IssueError(this,&lfc.Name);
LAB_0025adbc:
    std::__cxx11::string::~string((string *)&lfc);
LAB_0025adc6:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
    return false;
  }
  aVar6 = SeparationOkay;
  lVar7 = 0;
LAB_0025aa6b:
  this->Separation = aVar6;
  do {
    lVar3 = cmListFileLexer_GetCurrentLine(this->Lexer);
    pcVar2 = cmListFileLexer_Scan(this->Lexer);
    if (pcVar2 == (cmListFileLexer_Token *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
      lfc.Name._M_dataplus._M_p = (pointer)&lfc.Name.field_2;
      lfc.Name._M_string_length = 0;
      lfc.Name.field_2._M_local_buf[0] = '\0';
      lfc.FilePath._M_dataplus._M_p = (pointer)&lfc.FilePath.field_2;
      lfc.FilePath._M_string_length = 0;
      lfc.FilePath.field_2._M_local_buf[0] = '\0';
      lfc.Line = 0;
      std::__cxx11::string::assign((char *)&lfc.FilePath);
      lfc.Line = lVar3;
      std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)&lfbt
                 ,(__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)
                  &this->Backtrace);
      cmListFileBacktrace::Push((cmListFileBacktrace *)&local_1c8,(cmListFileContext *)&lfbt);
      std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)&lfbt
                 ,(__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)
                  &local_1c8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1c8._M_string_length);
      poVar4 = std::operator<<((ostream *)&error,"Parse error.  Function missing ending \")\".  ");
      std::operator<<(poVar4,"End of file reached.");
      this_00 = this->Messenger;
      std::__cxx11::stringbuf::str();
      cmMessenger::IssueMessage(this_00,FATAL_ERROR,&local_1c8,&lfbt);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&lfbt.TopEntry.
                  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      cmListFileContext::~cmListFileContext(&lfc);
      goto LAB_0025adc6;
    }
    aVar6 = SeparationWarning;
    switch(pcVar2->type) {
    case cmListFileLexer_Token_Space:
    case cmListFileLexer_Token_Newline:
      this->Separation = SeparationOkay;
      break;
    case cmListFileLexer_Token_Identifier:
    case cmListFileLexer_Token_ArgumentUnquoted:
      goto switchD_0025aaa7_caseD_3;
    case cmListFileLexer_Token_ParenLeft:
      lVar7 = lVar7 + 1;
      this->Separation = SeparationOkay;
      bVar1 = AddArgument(this,pcVar2,Unquoted);
      if (!bVar1) {
        return false;
      }
      break;
    case cmListFileLexer_Token_ParenRight:
      if (lVar7 == 0) {
        return true;
      }
      this->Separation = SeparationOkay;
      bVar1 = AddArgument(this,pcVar2,Unquoted);
      if (!bVar1) {
        return false;
      }
      lVar7 = lVar7 + -1;
      aVar6 = SeparationWarning;
      goto LAB_0025aa6b;
    case cmListFileLexer_Token_ArgumentQuoted:
      bVar1 = AddArgument(this,pcVar2,Quoted);
      goto LAB_0025ab4f;
    case cmListFileLexer_Token_ArgumentBracket:
      bVar1 = AddArgument(this,pcVar2,Bracket);
      aVar6 = SeparationError;
      goto LAB_0025ab4f;
    case cmListFileLexer_Token_CommentBracket:
      aVar6 = SeparationError;
      goto LAB_0025aa6b;
    default:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
      poVar4 = std::operator<<((ostream *)&error,"Parse error.  Function missing ending \")\".  ");
      poVar4 = std::operator<<(poVar4,"Instead found ");
      pcVar5 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar2->type);
      poVar4 = std::operator<<(poVar4,pcVar5);
      poVar4 = std::operator<<(poVar4," with text \"");
      poVar4 = std::operator<<(poVar4,pcVar2->text);
      std::operator<<(poVar4,"\".");
      std::__cxx11::stringbuf::str();
      IssueError(this,&lfc.Name);
      goto LAB_0025adbc;
    }
  } while( true );
switchD_0025aaa7_caseD_3:
  bVar1 = AddArgument(this,pcVar2,Unquoted);
LAB_0025ab4f:
  if (bVar1 == false) {
    return false;
  }
  goto LAB_0025aa6b;
}

Assistant:

bool cmListFileParser::ParseFunction(const char* name, long line)
{
  // Ininitialize a new function call.
  this->Function = cmListFileFunction();
  this->Function.Name = name;
  this->Function.Line = line;

  // Command name has already been parsed.  Read the left paren.
  cmListFileLexer_Token* token;
  while ((token = cmListFileLexer_Scan(this->Lexer)) &&
         token->type == cmListFileLexer_Token_Space) {
  }
  if (!token) {
    std::ostringstream error;
    /* clang-format off */
    error << "Unexpected end of file.\n"
          << "Parse error.  Function missing opening \"(\".";
    /* clang-format on */
    this->IssueError(error.str());
    return false;
  }
  if (token->type != cmListFileLexer_Token_ParenLeft) {
    std::ostringstream error;
    error << "Parse error.  Expected \"(\", got "
          << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
          << " with text \"" << token->text << "\".";
    this->IssueError(error.str());
    return false;
  }

  // Arguments.
  unsigned long lastLine;
  unsigned long parenDepth = 0;
  this->Separation = SeparationOkay;
  while (
    (static_cast<void>(lastLine = cmListFileLexer_GetCurrentLine(this->Lexer)),
     token = cmListFileLexer_Scan(this->Lexer))) {
    if (token->type == cmListFileLexer_Token_Space ||
        token->type == cmListFileLexer_Token_Newline) {
      this->Separation = SeparationOkay;
      continue;
    }
    if (token->type == cmListFileLexer_Token_ParenLeft) {
      parenDepth++;
      this->Separation = SeparationOkay;
      if (!this->AddArgument(token, cmListFileArgument::Unquoted)) {
        return false;
      }
    } else if (token->type == cmListFileLexer_Token_ParenRight) {
      if (parenDepth == 0) {
        return true;
      }
      parenDepth--;
      this->Separation = SeparationOkay;
      if (!this->AddArgument(token, cmListFileArgument::Unquoted)) {
        return false;
      }
      this->Separation = SeparationWarning;
    } else if (token->type == cmListFileLexer_Token_Identifier ||
               token->type == cmListFileLexer_Token_ArgumentUnquoted) {
      if (!this->AddArgument(token, cmListFileArgument::Unquoted)) {
        return false;
      }
      this->Separation = SeparationWarning;
    } else if (token->type == cmListFileLexer_Token_ArgumentQuoted) {
      if (!this->AddArgument(token, cmListFileArgument::Quoted)) {
        return false;
      }
      this->Separation = SeparationWarning;
    } else if (token->type == cmListFileLexer_Token_ArgumentBracket) {
      if (!this->AddArgument(token, cmListFileArgument::Bracket)) {
        return false;
      }
      this->Separation = SeparationError;
    } else if (token->type == cmListFileLexer_Token_CommentBracket) {
      this->Separation = SeparationError;
    } else {
      // Error.
      std::ostringstream error;
      error << "Parse error.  Function missing ending \")\".  "
            << "Instead found "
            << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
            << " with text \"" << token->text << "\".";
      this->IssueError(error.str());
      return false;
    }
  }

  std::ostringstream error;
  cmListFileContext lfc;
  lfc.FilePath = this->FileName;
  lfc.Line = lastLine;
  cmListFileBacktrace lfbt = this->Backtrace;
  lfbt = lfbt.Push(lfc);
  error << "Parse error.  Function missing ending \")\".  "
        << "End of file reached.";
  this->Messenger->IssueMessage(MessageType::FATAL_ERROR, error.str(), lfbt);
  return false;
}